

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_scalar.cpp
# Opt level: O0

void __thiscall
ear::PolarExtentCoreScalar::run(PolarExtentCoreScalar *this,PolarExtentCoreContext *ctx)

{
  float local_64;
  ulong uStack_50;
  extent_float_t gain_1;
  size_t speaker_idx_2;
  ulong uStack_40;
  extent_float_t gain;
  size_t speaker_idx_1;
  extent_float_t weight;
  ExtentPosition pos;
  size_t i;
  size_t speaker_idx;
  PolarExtentCoreContext *ctx_local;
  PolarExtentCoreScalar *this_local;
  
  for (i = 0; i < ctx->num_speakers; i = i + 1) {
    ctx->results[i] = 0.0;
  }
  pos.y = 0.0;
  pos.z = 0.0;
  for (; (ulong)pos._4_8_ < ctx->num_points; pos._4_8_ = pos._4_8_ + 1) {
    speaker_idx_1._4_4_ = ctx->xs[pos._4_8_];
    weight = ctx->ys[pos._4_8_];
    pos.x = ctx->zs[pos._4_8_];
    if ((ctx->is_circular & 1U) == 0) {
      local_64 = weight_stadium(this,ctx,(ExtentPosition *)((long)&speaker_idx_1 + 4));
    }
    else {
      local_64 = weight_circle(this,ctx,(ExtentPosition *)((long)&speaker_idx_1 + 4));
    }
    speaker_idx_1._0_4_ = local_64;
    if ((local_64 != 1.0) || (NAN(local_64))) {
      if ((local_64 != 0.0) || (NAN(local_64))) {
        for (uStack_50 = 0; uStack_50 < ctx->num_speakers; uStack_50 = uStack_50 + 1) {
          ctx->results[uStack_50] =
               local_64 * ctx->summed_panning_results[pos._4_8_ * ctx->num_speakers + uStack_50] +
               ctx->results[uStack_50];
        }
      }
    }
    else {
      for (uStack_40 = 0; uStack_40 < ctx->num_speakers; uStack_40 = uStack_40 + 1) {
        ctx->results[uStack_40] =
             ctx->summed_panning_results[pos._4_8_ * ctx->num_speakers + uStack_40] +
             ctx->results[uStack_40];
      }
    }
  }
  return;
}

Assistant:

void run(PolarExtentCoreContext &ctx) const override {
      for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
           speaker_idx++)
        ctx.results[speaker_idx] = 0.0;

      for (size_t i = 0; i < ctx.num_points; i++) {
        ExtentPosition pos;
        pos.x = ctx.xs[i];
        pos.y = ctx.ys[i];
        pos.z = ctx.zs[i];

        extent_float_t weight = ctx.is_circular ? weight_circle(ctx, pos)
                                                : weight_stadium(ctx, pos);

        // add to results, using summed_panning_results for both as this is in
        // a more efficient order
        if (weight == 1.0) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx++) {
            extent_float_t gain =
                ctx.summed_panning_results[i * ctx.num_speakers + speaker_idx];
            ctx.results[speaker_idx] += gain;
          }
        } else if (weight != 0) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx++) {
            extent_float_t gain =
                ctx.summed_panning_results[i * ctx.num_speakers + speaker_idx];
            ctx.results[speaker_idx] += weight * gain;
          }
        }
      }
    }